

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

bool __thiscall
soul::AST::TypeMetaFunction::checkSourceType(TypeMetaFunction *this,Type *sourceType)

{
  bool bVar1;
  bool local_2a;
  bool local_29;
  Type *sourceType_local;
  TypeMetaFunction *this_local;
  
  if (this->operation == size) {
    this_local._7_1_ = canTakeSizeOf(sourceType);
  }
  else if (this->operation == makeConst) {
    bVar1 = Type::isConst(sourceType);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else if (this->operation == elementType) {
    bVar1 = Type::isArrayOrVector(sourceType);
    local_29 = true;
    if (!bVar1) {
      local_29 = Type::isComplex(sourceType);
    }
    this_local._7_1_ = local_29;
  }
  else if (this->operation == primitiveType) {
    bVar1 = Type::isArray(sourceType);
    local_2a = true;
    if (!bVar1) {
      local_2a = Type::isStruct(sourceType);
    }
    this_local._7_1_ = (bool)((local_2a ^ 0xffU) & 1);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool checkSourceType (const Type& sourceType) const
        {
            if (operation == Op::size)           return canTakeSizeOf (sourceType);
            if (operation == Op::makeConst)      return ! sourceType.isConst();
            if (operation == Op::elementType)    return sourceType.isArrayOrVector() || sourceType.isComplex();
            if (operation == Op::primitiveType)  return ! (sourceType.isArray() || sourceType.isStruct());

            return true;
        }